

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O1

bool __thiscall
Fossilize::FeatureFilter::Impl::render_pass_is_supported(Impl *this,VkRenderPassCreateInfo *info)

{
  VkSubpassDescription *pVVar1;
  VkSubpassDependency *pVVar2;
  bool bVar3;
  const_iterator cVar4;
  uint format_features;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  VkDependencyFlags *pVVar8;
  ulong uVar9;
  long lVar10;
  bool bVar11;
  key_type local_50;
  
  if ((info->flags & 0xfffffffd) == 0) {
    if (info->flags == 0) {
      bVar11 = false;
    }
    else {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"VK_QCOM_render_pass_transform","");
      cVar4 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                      *)this,&local_50);
      bVar11 = cVar4.
               super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ._M_cur == (__node_type *)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    if (!bVar11) {
      if (this->null_device != false) {
        return true;
      }
      bVar11 = pnext_chain_is_supported(this,info->pNext);
      if (bVar11) {
        bVar11 = info->attachmentCount != 0;
        if (bVar11) {
          uVar9 = 0;
          do {
            format_features = 0;
            if ((ulong)info->subpassCount != 0) {
              pVVar1 = info->pSubpasses;
              uVar5 = 0;
              format_features = 0;
              do {
                if ((ulong)pVVar1[uVar5].colorAttachmentCount != 0) {
                  uVar6 = 0;
                  do {
                    uVar7 = format_features | 0x80;
                    if (uVar9 == pVVar1[uVar5].pColorAttachments[uVar6].attachment) {
                      format_features = uVar7;
                    }
                    if ((pVVar1[uVar5].pResolveAttachments != (VkAttachmentReference *)0x0) &&
                       (uVar9 == pVVar1[uVar5].pResolveAttachments[uVar6].attachment)) {
                      format_features = uVar7;
                    }
                    uVar6 = uVar6 + 1;
                  } while (pVVar1[uVar5].colorAttachmentCount != uVar6);
                }
                if ((ulong)pVVar1[uVar5].inputAttachmentCount != 0) {
                  uVar6 = 0;
                  do {
                    format_features =
                         format_features |
                         uVar9 == pVVar1[uVar5].pInputAttachments[uVar6].attachment;
                    uVar6 = uVar6 + 1;
                  } while (pVVar1[uVar5].inputAttachmentCount != uVar6);
                }
                if ((pVVar1[uVar5].pDepthStencilAttachment != (VkAttachmentReference *)0x0) &&
                   (uVar9 == (pVVar1[uVar5].pDepthStencilAttachment)->attachment)) {
                  format_features = format_features | 0x200;
                }
                uVar5 = uVar5 + 1;
              } while (uVar5 != info->subpassCount);
            }
            bVar3 = attachment_description_is_supported
                              (this,info->pAttachments + uVar9,format_features);
            if (!bVar3) {
              if (bVar11) {
                return false;
              }
              break;
            }
            uVar9 = uVar9 + 1;
            bVar11 = uVar9 < info->attachmentCount;
          } while (bVar11);
        }
        if (info->subpassCount != 0) {
          lVar10 = 0;
          uVar9 = 0;
          do {
            bVar11 = subpass_description_is_supported
                               (this,(VkSubpassDescription *)
                                     ((long)&info->pSubpasses->flags + lVar10));
            if (!bVar11) {
              return false;
            }
            uVar9 = uVar9 + 1;
            lVar10 = lVar10 + 0x48;
          } while (uVar9 < info->subpassCount);
        }
        uVar9 = (ulong)info->dependencyCount;
        bVar11 = uVar9 == 0;
        if (bVar11) {
          return bVar11;
        }
        pVVar2 = info->pDependencies;
        bVar3 = dependency_flags_is_supported(this,pVVar2->dependencyFlags);
        if (!bVar3) {
          return bVar11;
        }
        pVVar8 = &pVVar2[1].dependencyFlags;
        uVar5 = 1;
        do {
          uVar6 = uVar5;
          if (uVar9 == uVar6) break;
          bVar11 = dependency_flags_is_supported(this,*pVVar8);
          pVVar8 = pVVar8 + 7;
          uVar5 = uVar6 + 1;
        } while (bVar11);
        return uVar9 <= uVar6;
      }
    }
  }
  return false;
}

Assistant:

bool FeatureFilter::Impl::render_pass_is_supported(const VkRenderPassCreateInfo *info) const
{
	// Only allow flags we recognize and validate.
	constexpr VkRenderPassCreateFlags supported_flags = VK_RENDER_PASS_CREATE_TRANSFORM_BIT_QCOM;
	if ((info->flags & ~supported_flags) != 0)
		return false;

	if ((info->flags & VK_RENDER_PASS_CREATE_TRANSFORM_BIT_QCOM) != 0 &&
	    enabled_extensions.count(VK_QCOM_RENDER_PASS_TRANSFORM_EXTENSION_NAME) == 0)
		return false;

	if (null_device)
		return true;

	if (!pnext_chain_is_supported(info->pNext))
		return false;

	for (uint32_t i = 0; i < info->attachmentCount; i++)
	{
		VkFormatFeatureFlags format_features = 0;

		for (uint32_t j = 0; j < info->subpassCount; j++)
		{
			for (uint32_t k = 0; k < info->pSubpasses[j].colorAttachmentCount; k++)
			{
				if (info->pSubpasses[j].pColorAttachments[k].attachment == i)
					format_features |= VK_FORMAT_FEATURE_COLOR_ATTACHMENT_BIT;

				if (info->pSubpasses[j].pResolveAttachments &&
				    info->pSubpasses[j].pResolveAttachments[k].attachment == i)
				{
					format_features |= VK_FORMAT_FEATURE_COLOR_ATTACHMENT_BIT;
				}
			}

			for (uint32_t k = 0; k < info->pSubpasses[j].inputAttachmentCount; k++)
				if (info->pSubpasses[j].pInputAttachments[k].attachment == i)
					format_features |= VK_FORMAT_FEATURE_SAMPLED_IMAGE_BIT;

			if (info->pSubpasses[j].pDepthStencilAttachment &&
			    info->pSubpasses[j].pDepthStencilAttachment->attachment == i)
			{
				format_features |= VK_FORMAT_FEATURE_DEPTH_STENCIL_ATTACHMENT_BIT;
			}
		}

		if (!attachment_description_is_supported(info->pAttachments[i], format_features))
			return false;
	}

	for (uint32_t i = 0; i < info->subpassCount; i++)
	{
		if (!subpass_description_is_supported(info->pSubpasses[i]))
			return false;
	}

	for (uint32_t i = 0; i < info->dependencyCount; i++)
	{
		if (!subpass_dependency_is_supported(info->pDependencies[i]))
			return false;
	}

	return true;
}